

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test1<nrg::SyncExecutor>(char *title)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  anon_union_4_2_e8b08be2_for__Optional_base<int,_false>_2 aVar4;
  int i;
  allocator<char> local_109;
  Executor<nrg::SyncExecutor> ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  TimedCaller local_c8;
  AsyncResult<int> ar1;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_90;
  AsyncResult<int> ar2;
  optional<int> res3;
  AsyncResult<int> ar4;
  AsyncResult<int> ar3;
  ExceptionHandler local_50;
  
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = onError;
  local_50._M_invoker =
       std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
       _M_invoke;
  local_50.super__Function_base._M_manager =
       std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
       _M_manager;
  nrg::Executor<nrg::SyncExecutor>::Executor(&ex,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  i = 0x2a;
  ar1.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&std::cerr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8," -> start",(allocator<char> *)&ar2);
  std::operator+(&local_c8.msg_,title,&local_e8);
  nrg::SyncExecutor::operator()
            (&ex.executor_,print<std::__cxx11::string>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&ar1,
             &local_c8.msg_);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  i = i + 1;
  nrg::SyncExecutor::operator()(&ex.executor_,print2,&i,(char (*) [7])"hallo1");
  i = i + 1;
  nrg::SyncExecutor::operator()(&ex.executor_,print2,&i,(char (*) [7])"hallo2");
  i = i + 1;
  nrg::SyncExecutor::operator()(&ex.executor_,print2,&i,(char (*) [7])"hallo3");
  i = i + 1;
  nrg::SyncExecutor::operator()(&ex.executor_,print2,&i,(char (*) [7])"hallo4");
  i = i + 1;
  nrg::SyncExecutor::operator()(&ex.executor_,print2,&i,(char (*) [7])"hallo5");
  i = i + 1;
  nrg::SyncExecutor::operator()(&ex.executor_,print2,&i,(char (*) [7])"hallo6");
  nrg::SyncExecutor::operator()(&ex.executor_,exception);
  std::make_shared<nrg::AsyncResult<int>::Impl>();
  std::make_shared<nrg::AsyncResult<int>::Impl>();
  std::make_shared<nrg::AsyncResult<int>::Impl>();
  local_c8.msg_._M_dataplus._M_p._0_4_ = 0x2a;
  nrg::SyncExecutor::operator()(&ex.executor_,withResult,&ar1,&ar2,&ar3,(int *)&local_c8);
  iVar1 = nrg::AsyncResult<int>::Impl::getResult
                    (ar1.impl_.
                     super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  local_c8.msg_._M_dataplus._M_p = (pointer)0x0;
  iVar2 = nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
                    (&ar2,(duration<long,_std::ratio<1L,_1000L>_> *)&local_c8,0x2b);
  local_c8.msg_._M_dataplus._M_p = (pointer)0x0;
  nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
            ((Impl *)&res3,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  poVar3 = std::operator<<((ostream *)&std::cerr,"ar1: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,",  ar2: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,",  res3: ");
  aVar4._M_payload = 0;
  if (res3.super__Optional_base<int,_false>._M_engaged != false) {
    aVar4 = res3.super__Optional_base<int,_false>.field_0;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,aVar4._M_payload);
  std::operator<<(poVar3,"\n");
  std::chrono::_V2::steady_clock::now();
  std::make_shared<nrg::AsyncResult<int>::Impl>();
  nrg::SyncExecutor::operator()(&ex.executor_,roundTrip,&ar4);
  local_c8.msg_._M_dataplus._M_p = (pointer)0xc8;
  nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
            (&ar4,(duration<long,_std::ratio<1L,_1000L>_> *)&local_c8,99);
  std::chrono::_V2::steady_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"ar4 duration: ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3," ns\n");
  local_c8.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e8._M_dataplus._M_p._0_4_ = 0xfb;
  nrg::SyncExecutor::operator()
            (&ex.executor_,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c8,
             (int *)&local_e8);
  local_c8.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e8._M_dataplus._M_p._0_4_ = 0xfc;
  nrg::SyncExecutor::operator()
            (&ex.executor_,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c8,
             (int *)&local_e8);
  local_c8.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e8._M_dataplus._M_p._0_4_ = 0xfd;
  nrg::SyncExecutor::operator()
            (&ex.executor_,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c8,
             (int *)&local_e8);
  local_c8.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e8._M_dataplus._M_p._0_4_ = 0xfe;
  nrg::SyncExecutor::operator()
            (&ex.executor_,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c8,
             (int *)&local_e8);
  local_c8.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e8._M_dataplus._M_p._0_4_ = 0xff;
  nrg::SyncExecutor::operator()
            (&ex.executor_,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c8,
             (int *)&local_e8);
  local_c8.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e8._M_dataplus._M_p._0_4_ = 0x100;
  nrg::SyncExecutor::operator()
            (&ex.executor_,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c8,
             (int *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"no timeout",(allocator<char> *)&local_90);
  TimedCaller::TimedCaller(&local_c8,&local_e8);
  nrg::Executor<nrg::SyncExecutor>::operator()(&ex,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_90._M_data = (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8," -> done\n",&local_109);
  std::operator+(&local_c8.msg_,title,&local_e8);
  nrg::SyncExecutor::operator()(&ex.executor_,print<std::__cxx11::string>,&local_90,&local_c8.msg_);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar4.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar2.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar1.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&ex);
  return;
}

Assistant:

void test1(const char* title)
{
    nrg::Executor<ExecutionMode> ex(onError);
    int i = 42;
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> start"));
    ex(print2, ++i, "hallo1");
    ex(print2, ++i, "hallo2");
    ex(print2, ++i, "hallo3");
    ex(print2, ++i, "hallo4");
    ex(print2, ++i, "hallo5");
    ex(print2, ++i, "hallo6");

    ex(exception);

    nrg::AsyncResult<int> ar1;
    nrg::AsyncResult<int> ar2;
    nrg::AsyncResult<int> ar3;

    ex(withResult, ar1, ar2, ar3, 42);
    int res1 = ar1.getResult();
    int res2 = ar2.getResult(std::chrono::milliseconds(0), 43);
    std::experimental::optional<int> res3 = ar3.getResult(std::chrono::milliseconds(0));
    std::cerr <<  "ar1: " <<  res1 << ",  ar2: " << res2 << ",  res3: " << (res3 ? *res3 : 0) << "\n";

    auto t1 = now();

    nrg::AsyncResult<int> ar4;
    ex(roundTrip, ar4);
    ar4.getResult(std::chrono::milliseconds(200), 99);
    auto dur = now()-t1;
    std::cout <<  "ar4 duration: " << std::chrono::duration_cast<std::chrono::nanoseconds>(dur).count() << " ns\n";

    ex(print<int>, std::ref(std::cerr), 251);
    ex(print<int>, std::ref(std::cerr), 252);
    ex(print<int>, std::ref(std::cerr), 253);
    ex(print<int>, std::ref(std::cerr), 254);
    ex(print<int>, std::ref(std::cerr), 255);
    ex(print<int>, std::ref(std::cerr), 256);
    ex(TimedCaller("no timeout"));
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> done\n"));

    //std::this_thread::sleep_for(std::chrono::milliseconds(1000));
}